

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O3

string * __thiscall
RenX::getFormattedPlayerName_abi_cxx11_
          (string *__return_storage_ptr__,RenX *this,PlayerInfo *player)

{
  undefined **ppuVar1;
  size_type *psVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(this + 400),
             *(long *)(this + 0x198) + *(long *)(this + 400));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\x03");
  if (*(int *)(this + 0xf8) == 0) {
    ppuVar1 = &_ZL8GDIColor_1;
    psVar2 = &_ZL8GDIColor_0;
  }
  else if (*(int *)(this + 0xf8) == 1) {
    ppuVar1 = &_ZL8NodColor_1;
    psVar2 = &_ZL8NodColor_0;
  }
  else {
    ppuVar1 = &_ZL10OtherColor_1;
    psVar2 = &_ZL10OtherColor_0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,*ppuVar1,*psVar2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,*(char **)(this + 8),*(size_type *)(this + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::string RenX::getFormattedPlayerName(const RenX::PlayerInfo &player)
{
	std::string r = player.formatNamePrefix;
	r += IRCCOLOR;
	r += RenX::getTeamColor(player.team);
	r += player.name;
	return r;
}